

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen.pvip.y.c
# Opt level: O1

void yy_2_is_does_list(GREG *G,char *yytext,int yyleng,yythunk *thunk,PVIPParserContext yyxvar)

{
  PVIPNode *node;
  PVIPNode *child;
  
  node = G->val[-2];
  child = PVIP_node_new_children1(&G->data,PVIP_NODE_IS,G->val[-1]);
  PVIP_node_push_child(node,child);
  return;
}

Assistant:

YY_ACTION(void) yy_2_is_does_list(GREG *G, char *yytext, int yyleng, yythunk *thunk, YY_XTYPE YY_XVAR)
{
#define b G->val[-1]
#define a G->val[-2]
  yyprintf((stderr, "do yy_2_is_does_list"));
  yyprintfvTcontext(yytext);
  yyprintf((stderr, "\n  {PVIP_node_push_child(a, PVIP_node_new_children1(&(G->data), PVIP_NODE_IS, b)); }\n"));
  PVIP_node_push_child(a, PVIP_node_new_children1(&(G->data), PVIP_NODE_IS, b)); ;
#undef b
#undef a
}